

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O0

void test_array_remove(void)

{
  int32_t iVar1;
  size_t sVar2;
  int i;
  VALUE *v;
  VALUE a;
  int N;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar3;
  VALUE *in_stack_ffffffffffffffe0;
  VALUE *in_stack_ffffffffffffffe8;
  size_t in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 uVar4;
  
  uVar4 = 100000;
  value_init_array((VALUE *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  for (iVar3 = 0; iVar3 < 100000; iVar3 = iVar3 + 1) {
    in_stack_ffffffffffffffe0 = value_array_append(in_stack_ffffffffffffffe0);
    value_init_int32((VALUE *)CONCAT44(iVar3,in_stack_ffffffffffffffd8),0);
  }
  value_array_remove_range
            ((VALUE *)CONCAT44(uVar4,in_stack_fffffffffffffff8),in_stack_fffffffffffffff0,
             (size_t)in_stack_ffffffffffffffe8);
  sVar2 = value_array_size((VALUE *)CONCAT44(iVar3,in_stack_ffffffffffffffd8));
  acutest_check_((int)(ulong)(sVar2 == 80000),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x2ed,"%s","value_array_size(&a) == N - (N / 5)");
  for (iVar3 = 0; iVar3 < 10000; iVar3 = iVar3 + 1) {
    in_stack_ffffffffffffffe0 =
         value_array_get(in_stack_ffffffffffffffe8,(size_t)in_stack_ffffffffffffffe0);
    iVar1 = value_int32((VALUE *)CONCAT44(uVar4,in_stack_fffffffffffffff8));
    acutest_check_((int)(ulong)(iVar1 == iVar3),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                   ,0x2f1,"%s","value_int32(v) == i");
  }
  for (iVar3 = 10000; iVar3 < 79999; iVar3 = iVar3 + 1) {
    in_stack_ffffffffffffffe0 =
         value_array_get(in_stack_ffffffffffffffe8,(size_t)in_stack_ffffffffffffffe0);
    iVar1 = value_int32((VALUE *)CONCAT44(uVar4,in_stack_fffffffffffffff8));
    acutest_check_((int)(ulong)(iVar1 == iVar3 + 20000),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                   ,0x2f6,"%s","value_int32(v) == i + N / 5");
  }
  value_fini((VALUE *)0x10ba31);
  return;
}

Assistant:

static void
test_array_remove(void)
{
    const int N = 100000;

    VALUE a;
    VALUE* v;
    int i;

    value_init_array(&a);
    for(i = 0; i < N; i++) {
        v = value_array_append(&a);
        value_init_int32(v, i);
    }

    value_array_remove_range(&a, N / 10, N / 5);
    TEST_CHECK(value_array_size(&a) == N - (N / 5));

    for(i = 0; i < N / 10; i++) {
        v = value_array_get(&a, i);
        TEST_CHECK(value_int32(v) == i);
    }

    for(i = N / 10; i < N - (N / 5) - 1; i++) {
        v = value_array_get(&a, i);
        TEST_CHECK(value_int32(v) == i + N / 5);
    }

    value_fini(&a);
}